

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O3

void __thiscall rsg::AssignOp::~AssignOp(AssignOp *this)

{
  ~AssignOp(this);
  operator_delete(this,0xb0);
  return;
}

Assistant:

AssignOp::~AssignOp (void)
{
	delete m_lvalueExpr;
	delete m_rvalueExpr;
}